

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::drawPattern
          (CoverageMaskInvertCase *this,bool invertSampleCoverage)

{
  GLenum err;
  int i;
  int iVar1;
  float fVar2;
  float __x;
  float fVar3;
  Vec2 local_70;
  Vec2 local_68;
  Vec2 local_60;
  float local_58;
  Vec4 local_48;
  
  for (iVar1 = 0; iVar1 != 0x19; iVar1 = iVar1 + 1) {
    local_58 = (float)iVar1;
    glwSampleCoverage(local_58 / 24.0,invertSampleCoverage);
    err = glwGetError();
    glu::checkError(err,
                    "glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x614);
    fVar3 = (local_58 * 6.2831855) / 25.0;
    __x = ((local_58 + 0.5) * 6.2831855) / 25.0;
    local_60.m_data[0] = 0.0;
    local_60.m_data[1] = 0.0;
    fVar2 = cosf(fVar3);
    fVar3 = sinf(fVar3);
    local_68.m_data[1] = fVar3 * (float)0x3f733333;
    local_68.m_data[0] = fVar2 * (float)0x3f733333;
    fVar2 = cosf(__x);
    fVar3 = sinf(__x);
    local_70.m_data[1] = fVar3 * (float)0x3f733333;
    local_70.m_data[0] = fVar2 * (float)0x3f733333;
    fVar2 = local_58 / 25.0;
    local_48.m_data[0] = fVar2 * 0.6 + 0.4;
    local_48.m_data[1] = fVar2 * 0.3 + 0.5;
    local_48.m_data[2] = -fVar2 * 0.5 + 0.6;
    local_48.m_data[3] = -fVar2 * 0.7 + 0.7;
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,&local_60,&local_68,&local_70,&local_48);
  }
  return;
}

Assistant:

void CoverageMaskInvertCase::drawPattern (bool invertSampleCoverage) const
{
	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		GLU_CHECK_CALL(glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE));

		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(0.4f + (float)i/(float)numTriangles*0.6f,
							0.5f + (float)i/(float)numTriangles*0.3f,
							0.6f - (float)i/(float)numTriangles*0.5f,
							0.7f - (float)i/(float)numTriangles*0.7f));
	}
}